

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

int Ivy_FraigRefineClass_rec(Ivy_FraigMan_t *p,Ivy_Obj_t *pClass)

{
  int *piVar1;
  Ivy_Obj_t **ppIVar2;
  uint uVar3;
  uint uVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_FraigSim_t *pSims0;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *pIVar7;
  int iVar8;
  Ivy_Obj_t *pClass_00;
  long lVar9;
  ulong uVar10;
  Ivy_Obj_t *pIVar11;
  long lVar12;
  int iVar13;
  
  iVar8 = 0;
  iVar13 = 0;
  while (pClass->pNextFan1 != (Ivy_Obj_t *)0x0) {
    pIVar5 = pClass->pFanout;
    uVar3 = p->nSimWords;
    pIVar6 = pClass;
    pClass_00 = pClass->pNextFan1;
    while ((int)uVar3 < 1) {
LAB_0078d62c:
      ppIVar2 = &pClass_00->pNextFan1;
      pIVar6 = pClass_00;
      pClass_00 = *ppIVar2;
      if (*ppIVar2 == (Ivy_Obj_t *)0x0) goto LAB_0078d75d;
    }
    uVar10 = 0;
    while (*(int *)((long)&pIVar5->pFanout + uVar10 * 4) ==
           *(int *)((long)&pClass_00->pFanout->pFanout + uVar10 * 4)) {
      uVar10 = uVar10 + 1;
      if (uVar3 == uVar10) goto LAB_0078d62c;
    }
    if ((0 < (int)uVar3) && (p->pParams->fPatScores != 0)) {
      pIVar7 = pClass_00->pFanout;
      lVar9 = 0;
      do {
        uVar3 = *(uint *)((long)&pIVar5->pFanout + lVar9 * 4);
        uVar4 = *(uint *)((long)&pIVar7->pFanout + lVar9 * 4);
        if (uVar3 != uVar4) {
          lVar12 = 0;
          do {
            if (((uVar4 ^ uVar3) >> ((uint)lVar12 & 0x1f) & 1) != 0) {
              p->pPatScores[(ulong)((uint)lVar9 & 0x7ffffff) * 0x20 + lVar12] =
                   p->pPatScores[(ulong)((uint)lVar9 & 0x7ffffff) * 0x20 + lVar12] + 1;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x20);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < p->nSimWords);
    }
    pClass_00->pNextFan0 = (Ivy_Obj_t *)0x0;
    pIVar7 = pClass_00->pNextFan1;
    pIVar11 = pClass_00;
    if (pIVar7 != (Ivy_Obj_t *)0x0) {
      uVar3 = p->nSimWords;
      do {
        if ((int)uVar3 < 1) {
LAB_0078d6d4:
          pIVar6->pNextFan1 = pIVar7;
          pIVar6 = pIVar7;
        }
        else {
          uVar10 = 0;
          while (*(int *)((long)&pIVar5->pFanout + uVar10 * 4) ==
                 *(int *)((long)&pIVar7->pFanout->pFanout + uVar10 * 4)) {
            uVar10 = uVar10 + 1;
            if (uVar3 == uVar10) goto LAB_0078d6d4;
          }
          pIVar11->pNextFan1 = pIVar7;
          pIVar7->pNextFan0 = pClass_00;
          pIVar11 = pIVar7;
        }
        pIVar7 = pIVar7->pNextFan1;
      } while (pIVar7 != (Ivy_Obj_t *)0x0);
    }
    pIVar11->pNextFan1 = (Ivy_Obj_t *)0x0;
    pIVar6->pNextFan1 = (Ivy_Obj_t *)0x0;
    pClass_00->pPrevFan1 = pClass;
    pClass_00->pPrevFan0 = pClass->pPrevFan0;
    if (pClass->pPrevFan0 != (Ivy_Obj_t *)0x0) {
      pClass->pPrevFan0->pPrevFan1 = pClass_00;
    }
    pClass->pPrevFan0 = pClass_00;
    if ((p->lClasses).pTail == pClass) {
      (p->lClasses).pTail = pClass_00;
    }
    piVar1 = &(p->lClasses).nItems;
    *piVar1 = *piVar1 + 1;
    if (pClass->pNextFan1 == (Ivy_Obj_t *)0x0) {
      Ivy_FraigRemoveClass(&p->lClasses,pClass);
    }
    if (pClass_00->pNextFan1 == (Ivy_Obj_t *)0x0) {
      Ivy_FraigRemoveClass(&p->lClasses,pClass_00);
      iVar13 = 1;
      break;
    }
    iVar8 = iVar8 + 1;
    pClass = pClass_00;
  }
LAB_0078d75d:
  return iVar8 + iVar13;
}

Assistant:

int Ivy_FraigRefineClass_rec( Ivy_FraigMan_t * p, Ivy_Obj_t * pClass )
{
    Ivy_Obj_t * pClassNew, * pListOld, * pListNew, * pNode;
    int RetValue = 0;
    // check if there is refinement
    pListOld = pClass;
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClass), pClassNew )
    {
        if ( !Ivy_NodeCompareSims(p, pClass, pClassNew) )
        {
            if ( p->pParams->fPatScores )
                Ivy_FraigAddToPatScores( p, pClass, pClassNew );
            break;
        }
        pListOld = pClassNew;
    }
    if ( pClassNew == NULL )
        return 0;
    // set representative of the new class
    Ivy_ObjSetClassNodeRepr( pClassNew, NULL );
    // start the new list
    pListNew = pClassNew;
    // go through the remaining nodes and sort them into two groups:
    // (1) matches of the old node; (2) non-matches of the old node
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClassNew), pNode )
        if ( Ivy_NodeCompareSims( p, pClass, pNode ) )
        {
            Ivy_ObjSetClassNodeNext( pListOld, pNode );
            pListOld = pNode;
        }
        else
        {
            Ivy_ObjSetClassNodeNext( pListNew, pNode );
            Ivy_ObjSetClassNodeRepr( pNode, pClassNew );
            pListNew = pNode;
        }
    // finish both lists
    Ivy_ObjSetClassNodeNext( pListNew, NULL );
    Ivy_ObjSetClassNodeNext( pListOld, NULL );
    // update the list of classes
    Ivy_FraigInsertClass( &p->lClasses, pClass, pClassNew );
    // if the old class is trivial, remove it
    if ( Ivy_ObjClassNodeNext(pClass) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClass );
    // if the new class is trivial, remove it; otherwise, try to refine it
    if ( Ivy_ObjClassNodeNext(pClassNew) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClassNew );
    else
        RetValue = Ivy_FraigRefineClass_rec( p, pClassNew );
    return RetValue + 1;
}